

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

void Saig_TsiStateInsert(Saig_Tsim_t *p,uint *pState,int nWords)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  if (nWords < 1) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ Saig_TsiStateHash::s_FPrimes[(uint)uVar3 & 0x7f] * pState[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)nWords != uVar3);
  }
  uVar1 = p->nBins;
  iVar2 = Saig_TsiStateLookup(p,pState,nWords);
  if (iVar2 != 0) {
    __assert_fail("!Saig_TsiStateLookup( p, pState, nWords )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigPhase.c"
                  ,0x1a4,"void Saig_TsiStateInsert(Saig_Tsim_t *, unsigned int *, int)");
  }
  uVar4 = uVar4 % uVar1;
  *(uint **)(pState + nWords) = p->pBins[(int)uVar4];
  p->pBins[(int)uVar4] = pState;
  return;
}

Assistant:

void Saig_TsiStateInsert( Saig_Tsim_t * p, unsigned * pState, int nWords )
{
    int Hash = Saig_TsiStateHash( pState, nWords, p->nBins );
    assert( !Saig_TsiStateLookup( p, pState, nWords ) );
    Saig_TsiSetNext( pState, nWords, p->pBins[Hash] );
    p->pBins[Hash] = pState;    
}